

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.h
# Opt level: O0

void __thiscall muduo::Logger::SourceFile::SourceFile<100>(SourceFile *this,char (*arr) [100])

{
  char *pcVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *slash;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 99;
  pcVar1 = strrchr((char *)*in_RDI,0x2f);
  if (pcVar1 != (char *)0x0) {
    *in_RDI = pcVar1 + 1;
    *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) - ((int)*in_RDI - (int)in_RSI);
  }
  return;
}

Assistant:

SourceFile(const char (&arr)[N])
      : data_(arr),
        size_(N-1)
    {
      const char* slash = strrchr(data_, '/'); // builtin function
      if (slash)
      {
        data_ = slash + 1;
        size_ -= static_cast<int>(data_ - arr);
      }
    }